

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

string * cmSystemTools::ComputeStringMD5(string *__return_storage_ptr__,string *input)

{
  undefined1 local_28 [8];
  cmCryptoHashMD5 md5;
  string *input_local;
  
  md5.MD5 = (cmsysMD5_s *)input;
  cmCryptoHashMD5::cmCryptoHashMD5((cmCryptoHashMD5 *)local_28);
  cmCryptoHash::HashString(__return_storage_ptr__,(cmCryptoHash *)local_28,(string *)md5.MD5);
  cmCryptoHashMD5::~cmCryptoHashMD5((cmCryptoHashMD5 *)local_28);
  return __return_storage_ptr__;
}

Assistant:

std::string cmSystemTools::ComputeStringMD5(const std::string& input)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  cmCryptoHashMD5 md5;
  return md5.HashString(input);
#else
  (void)input;
  cmSystemTools::Message("md5sum not supported in bootstrapping mode","Error");
  return "";
#endif
}